

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

ssize_t __thiscall
duckdb_httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  pointer __src;
  int iVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  void *__dest;
  void *__n;
  undefined8 unaff_R14;
  void *__n_00;
  size_t in_stack_00000018;
  int in_stack_00000020;
  socket_t in_stack_00000024;
  size_t in_stack_00000048;
  void *in_stack_00000050;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  __n_00 = (void *)0x7fffffffffffffff;
  if (__buf < (void *)0x7fffffffffffffff) {
    __n_00 = __buf;
  }
  uVar1 = this->read_buff_off_;
  __n = (void *)(this->read_buff_content_size_ - uVar1);
  if (this->read_buff_content_size_ < uVar1 || __n == (void *)0x0) {
    iVar2 = (*(this->super_Stream)._vptr_Stream[2])(this);
    if ((char)iVar2 == '\0') {
      __n = (void *)0xffffffffffffffff;
    }
    else {
      this->read_buff_off_ = 0;
      this->read_buff_content_size_ = 0;
      if ((void *)0xfff < __buf) {
        sVar3 = read_socket(in_stack_00000024,in_stack_00000050,in_stack_00000048,in_stack_00000020)
        ;
        return sVar3;
      }
      __n = (void *)read_socket((socket_t)((ulong)unaff_R14 >> 0x20),
                                (void *)CONCAT44(in_stack_00000024,in_stack_00000020),
                                in_stack_00000018,(int)unaff_R14);
      if (0 < (long)__n) {
        __src = (this->read_buff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
        if (__buf < __n) {
          switchD_0193dc74::default(__dest,__src,(size_t)__n_00);
          this->read_buff_off_ = (size_t)__n_00;
          this->read_buff_content_size_ = (size_t)__n;
          __n = __buf;
        }
        else {
          switchD_0193dc74::default(__dest,__src,(size_t)__n);
        }
      }
    }
  }
  else {
    if (__n_00 < __n) {
      __n = __n_00;
    }
    switchD_0193dc74::default
              (__dest,(this->read_buff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar1,(size_t)__n);
    this->read_buff_off_ = this->read_buff_off_ + (long)__n;
  }
  return (ssize_t)__n;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
#ifdef _WIN32
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#else
  size = (std::min)(size,
                    static_cast<size_t>((std::numeric_limits<ssize_t>::max)()));
#endif

  if (read_buff_off_ < read_buff_content_size_) {
    auto remaining_size = read_buff_content_size_ - read_buff_off_;
    if (size <= remaining_size) {
      memcpy(ptr, read_buff_.data() + read_buff_off_, size);
      read_buff_off_ += size;
      return static_cast<ssize_t>(size);
    } else {
      memcpy(ptr, read_buff_.data() + read_buff_off_, remaining_size);
      read_buff_off_ += remaining_size;
      return static_cast<ssize_t>(remaining_size);
    }
  }

  if (!is_readable()) { return -1; }

  read_buff_off_ = 0;
  read_buff_content_size_ = 0;

  if (size < read_buff_size_) {
    auto n = read_socket(sock_, read_buff_.data(), read_buff_size_,
                         CPPHTTPLIB_RECV_FLAGS);
    if (n <= 0) {
      return n;
    } else if (n <= static_cast<ssize_t>(size)) {
      memcpy(ptr, read_buff_.data(), static_cast<size_t>(n));
      return n;
    } else {
      memcpy(ptr, read_buff_.data(), size);
      read_buff_off_ = size;
      read_buff_content_size_ = static_cast<size_t>(n);
      return static_cast<ssize_t>(size);
    }
  } else {
    return read_socket(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS);
  }
}